

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O0

unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
__thiscall
duckdb::CompressedMaterialization::GetStringCompress
          (CompressedMaterialization *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *input,
          BaseStatistics *stats)

{
  byte bVar1;
  bool bVar2;
  LogicalTypeId LVar3;
  byte bVar4;
  idx_t iVar5;
  ulong uVar6;
  undefined1 *puVar7;
  byte *pbVar8;
  BaseStatistics *in_RCX;
  BaseStatistics *in_RDX;
  unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_> in_RDI;
  templated_unique_single_t compress_expr;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  arguments;
  ScalarFunction compress_function;
  Value max_val;
  Value min_val;
  uint8_t max_numeric;
  uint8_t min_numeric;
  string max_string;
  string min_string;
  BaseStatistics compress_stats;
  LogicalType *compressed_type;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::LogicalType,_true> *__range1;
  LogicalType cast_type;
  uint32_t max_string_length;
  BaseStatistics *in_stack_fffffffffffffb58;
  ScalarFunction *in_stack_fffffffffffffb60;
  BaseStatistics *in_stack_fffffffffffffb68;
  BaseStatistics *in_stack_fffffffffffffb70;
  undefined8 in_stack_fffffffffffffb78;
  LogicalTypeId id;
  LogicalType *in_stack_fffffffffffffb80;
  ulong in_stack_fffffffffffffb98;
  uint8_t value;
  undefined7 in_stack_fffffffffffffba0;
  PhysicalType in_stack_fffffffffffffba7;
  LogicalType *in_stack_fffffffffffffbc8;
  LogicalType *in_stack_fffffffffffffcb8;
  void **in_stack_fffffffffffffd00;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_fffffffffffffd08;
  ScalarFunction *in_stack_fffffffffffffd10;
  LogicalType *in_stack_fffffffffffffd18;
  undefined1 local_2a8 [334];
  byte local_15a;
  undefined1 local_159;
  string local_158 [32];
  string local_138 [56];
  BaseStatistics local_100;
  reference local_90;
  undefined4 local_84;
  LogicalType *local_80;
  __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
  local_78 [3];
  undefined1 local_60 [24];
  undefined1 *local_48;
  LogicalType local_40;
  uint32_t local_24;
  BaseStatistics *local_20;
  
  local_20 = in_RCX;
  bVar2 = StringStats::HasMaxStringLength(in_stack_fffffffffffffb58);
  if (bVar2) {
    local_24 = StringStats::MaxStringLength
                         ((BaseStatistics *)
                          CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
    LogicalType::LogicalType
              (in_stack_fffffffffffffb80,(LogicalTypeId)((ulong)in_stack_fffffffffffffb78 >> 0x38));
    CMUtils::StringTypes();
    local_48 = local_60;
    local_78[0]._M_current =
         (LogicalType *)
         ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::begin
                   ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                    in_stack_fffffffffffffb58);
    local_80 = (LogicalType *)
               ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::end
                         ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                          in_stack_fffffffffffffb58);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                          *)in_stack_fffffffffffffb60,
                         (__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                          *)in_stack_fffffffffffffb58);
      id = (LogicalTypeId)((ulong)in_stack_fffffffffffffb78 >> 0x38);
      if (!bVar2) break;
      local_90 = __gnu_cxx::
                 __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                 ::operator*(local_78);
      in_stack_fffffffffffffb98 = (ulong)local_24;
      in_stack_fffffffffffffba7 = LogicalType::InternalType(local_90);
      iVar5 = GetTypeIdSize((PhysicalType)((ulong)in_RDX >> 0x38));
      id = (LogicalTypeId)((ulong)in_stack_fffffffffffffb78 >> 0x38);
      if (in_stack_fffffffffffffb98 < iVar5) {
        LogicalType::operator=
                  (&in_stack_fffffffffffffb68->type,(LogicalType *)in_stack_fffffffffffffb60);
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
      ::operator++(local_78);
    }
    local_84 = 2;
    vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xcfd5ec);
    LogicalType::LogicalType(in_stack_fffffffffffffb80,id);
    bVar2 = LogicalType::operator==
                      (&in_stack_fffffffffffffb68->type,(LogicalType *)in_stack_fffffffffffffb60);
    LogicalType::~LogicalType((LogicalType *)0xcfd625);
    if (bVar2) {
      unique_ptr<duckdb::CompressExpression,std::default_delete<duckdb::CompressExpression>,true>::
      unique_ptr<std::default_delete<duckdb::CompressExpression>,void>
                ((unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
                  *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      local_84 = 1;
    }
    else {
      LogicalType::LogicalType
                ((LogicalType *)in_stack_fffffffffffffb60,&in_stack_fffffffffffffb58->type);
      BaseStatistics::CreateEmpty(in_stack_fffffffffffffbc8);
      LogicalType::~LogicalType((LogicalType *)0xcfd6ae);
      BaseStatistics::CopyBase(&local_100,local_20);
      LVar3 = LogicalType::id(&local_40);
      if (LVar3 == USMALLINT) {
        StringStats::Min_abi_cxx11_(in_stack_fffffffffffffb68);
        StringStats::Max_abi_cxx11_(in_stack_fffffffffffffb68);
        local_159 = 0;
        if ((local_24 != 0) && (uVar6 = ::std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
          puVar7 = (undefined1 *)::std::__cxx11::string::c_str();
          local_159 = *puVar7;
        }
        local_15a = 0;
        if ((local_24 != 0) && (uVar6 = ::std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
          pbVar8 = (byte *)::std::__cxx11::string::c_str();
          local_15a = *pbVar8;
        }
        Value::USMALLINT((uint16_t)(in_stack_fffffffffffffb98 >> 0x30));
        Value::USMALLINT((uint16_t)(in_stack_fffffffffffffb98 >> 0x30));
        bVar1 = local_15a;
        value = (uint8_t)(in_stack_fffffffffffffb98 >> 0x38);
        bVar4 = NumericLimits<unsigned_char>::Maximum();
        if (bVar1 < bVar4) {
          LogicalType::LogicalType(in_stack_fffffffffffffb80,id);
          LogicalType::operator=
                    ((LogicalType *)in_stack_fffffffffffffb60,&in_stack_fffffffffffffb58->type);
          LogicalType::~LogicalType((LogicalType *)0xcfd879);
          LogicalType::LogicalType
                    ((LogicalType *)in_stack_fffffffffffffb60,&in_stack_fffffffffffffb58->type);
          BaseStatistics::CreateEmpty(in_stack_fffffffffffffbc8);
          in_stack_fffffffffffffb70 = &local_100;
          in_stack_fffffffffffffb68 = (BaseStatistics *)(local_2a8 + 0x58);
          BaseStatistics::operator=
                    ((BaseStatistics *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
          BaseStatistics::~BaseStatistics((BaseStatistics *)in_stack_fffffffffffffb60);
          LogicalType::~LogicalType((LogicalType *)0xcfd8da);
          BaseStatistics::CopyBase(in_stack_fffffffffffffb70,local_20);
          Value::UTINYINT(value);
          in_stack_fffffffffffffb60 = (ScalarFunction *)local_2a8;
          Value::operator=((Value *)in_stack_fffffffffffffb60,(Value *)in_stack_fffffffffffffb58);
          Value::~Value((Value *)in_stack_fffffffffffffb60);
          Value::UTINYINT(value);
          Value::operator=((Value *)in_stack_fffffffffffffb60,(Value *)in_stack_fffffffffffffb58);
          Value::~Value((Value *)in_stack_fffffffffffffb60);
        }
        NumericStats::SetMin(in_stack_fffffffffffffb70,(Value *)in_stack_fffffffffffffb68);
        NumericStats::SetMax(in_stack_fffffffffffffb70,(Value *)in_stack_fffffffffffffb68);
        Value::~Value((Value *)in_stack_fffffffffffffb60);
        Value::~Value((Value *)in_stack_fffffffffffffb60);
        ::std::__cxx11::string::~string(local_158);
        ::std::__cxx11::string::~string(local_138);
      }
      CMStringCompressFun::GetFunction(in_stack_fffffffffffffcb8);
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)0xcfda9c);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  *)in_stack_fffffffffffffb70,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffb68);
      make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr)>
                (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                 in_stack_fffffffffffffd00);
      BaseStatistics::ToUnique(in_RDX);
      make_uniq<duckdb::CompressExpression,duckdb::unique_ptr<duckdb::BoundFunctionExpression,std::default_delete<duckdb::BoundFunctionExpression>,true>,duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                ((unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                  *)in_RDX,
                 (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                   *)0xcfdb12);
      local_84 = 1;
      unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
      ::~unique_ptr((unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                     *)0xcfdb27);
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 *)0xcfdb34);
      ScalarFunction::~ScalarFunction(in_stack_fffffffffffffb60);
      BaseStatistics::~BaseStatistics((BaseStatistics *)in_stack_fffffffffffffb60);
    }
    LogicalType::~LogicalType((LogicalType *)0xcfdbda);
  }
  else {
    unique_ptr<duckdb::CompressExpression,std::default_delete<duckdb::CompressExpression>,true>::
    unique_ptr<std::default_delete<duckdb::CompressExpression>,void>
              ((unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
                *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  }
  return (unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>)
         (__uniq_ptr_impl<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>
          )in_RDI._M_t.
           super___uniq_ptr_impl<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::CompressExpression_*,_std::default_delete<duckdb::CompressExpression>_>
           .super__Head_base<0UL,_duckdb::CompressExpression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<CompressExpression> CompressedMaterialization::GetStringCompress(unique_ptr<Expression> input,
                                                                            const BaseStatistics &stats) {
	if (!StringStats::HasMaxStringLength(stats)) {
		return nullptr;
	}

	const auto max_string_length = StringStats::MaxStringLength(stats);
	LogicalType cast_type = LogicalType::INVALID;
	for (const auto &compressed_type : CMUtils::StringTypes()) {
		if (max_string_length < GetTypeIdSize(compressed_type.InternalType())) {
			cast_type = compressed_type;
			break;
		}
	}
	if (cast_type == LogicalType::INVALID) {
		return nullptr;
	}

	auto compress_stats = BaseStatistics::CreateEmpty(cast_type);
	compress_stats.CopyBase(stats);
	if (cast_type.id() == LogicalTypeId::USMALLINT) {
		auto min_string = StringStats::Min(stats);
		auto max_string = StringStats::Max(stats);

		uint8_t min_numeric = 0;
		if (max_string_length != 0 && !min_string.empty()) {
			min_numeric = *reinterpret_cast<const uint8_t *>(min_string.c_str());
		}
		uint8_t max_numeric = 0;
		if (max_string_length != 0 && !max_string.empty()) {
			max_numeric = *reinterpret_cast<const uint8_t *>(max_string.c_str());
		}

		Value min_val = Value::USMALLINT(min_numeric);
		Value max_val = Value::USMALLINT(max_numeric + 1);
		if (max_numeric < NumericLimits<uint8_t>::Maximum()) {
			cast_type = LogicalType::UTINYINT;
			compress_stats = BaseStatistics::CreateEmpty(cast_type);
			compress_stats.CopyBase(stats);
			min_val = Value::UTINYINT(min_numeric);
			max_val = Value::UTINYINT(max_numeric + 1);
		}

		NumericStats::SetMin(compress_stats, min_val);
		NumericStats::SetMax(compress_stats, max_val);
	}

	auto compress_function = CMStringCompressFun::GetFunction(cast_type);
	vector<unique_ptr<Expression>> arguments;
	arguments.emplace_back(std::move(input));
	auto compress_expr =
	    make_uniq<BoundFunctionExpression>(cast_type, compress_function, std::move(arguments), nullptr);
	return make_uniq<CompressExpression>(std::move(compress_expr), compress_stats.ToUnique());
}